

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QCborKnownTags tag)

{
  long lVar1;
  char *pcVar2;
  QDebug *pQVar3;
  int in_EDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char *id;
  QDebugStateSaver saver;
  int in_stack_ffffffffffffff6c;
  QDebugStateSaver *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff88;
  QDebugStateSaver *in_stack_ffffffffffffff90;
  QDebug *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pcVar2 = qt_cbor_tag_id((long)in_EDX);
  if (pcVar2 == (char *)0x0) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff70 =
         (QDebugStateSaver *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,
                            (char)((uint)in_stack_ffffffffffffff6c >> 0x18));
    QDebug::QDebug((QDebug *)in_RDI,(QDebug *)in_stack_ffffffffffffff70);
  }
  else {
    QDebug::nospace(in_RSI);
    pQVar3 = QDebug::operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
    pQVar3 = QDebug::operator<<(pQVar3,in_stack_ffffffffffffffc8);
    QDebug::QDebug((QDebug *)in_RDI,pQVar3);
  }
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, QCborKnownTags tag)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_tag_id(QCborTag(int(tag)));
    if (id)
        return dbg.nospace() << "QCborKnownTags::" << id;

    return dbg.nospace() << "QCborKnownTags(" << int(tag) << ')';
}